

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int sasl_mechanisms_get_sasl_server_mechanisms
              (SASL_MECHANISMS_HANDLE sasl_mechanisms,AMQP_VALUE *sasl_server_mechanisms_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  AMQP_VALUE single_amqp_value;
  char *pcStack_38;
  int get_single_value_result;
  char *sasl_server_mechanisms_single_value;
  AMQP_VALUE item_value;
  SASL_MECHANISMS_INSTANCE *sasl_mechanisms_instance;
  uint32_t item_count;
  int result;
  AMQP_VALUE *sasl_server_mechanisms_value_local;
  SASL_MECHANISMS_HANDLE sasl_mechanisms_local;
  
  if (sasl_mechanisms == (SASL_MECHANISMS_HANDLE)0x0) {
    sasl_mechanisms_instance._4_4_ = 0x2852;
  }
  else {
    item_value = (AMQP_VALUE)sasl_mechanisms;
    _item_count = sasl_server_mechanisms_value;
    sasl_server_mechanisms_value_local = &sasl_mechanisms->composite_value;
    iVar1 = amqpvalue_get_composite_item_count
                      (sasl_mechanisms->composite_value,(uint32_t *)&sasl_mechanisms_instance);
    if (iVar1 == 0) {
      if ((int)sasl_mechanisms_instance == 0) {
        sasl_mechanisms_instance._4_4_ = 0x2860;
      }
      else {
        sasl_server_mechanisms_single_value =
             (char *)amqpvalue_get_composite_item_in_place(*(AMQP_VALUE *)item_value,0);
        if (((AMQP_VALUE)sasl_server_mechanisms_single_value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type((AMQP_VALUE)sasl_server_mechanisms_single_value),
           AVar2 == AMQP_TYPE_NULL)) {
          sasl_mechanisms_instance._4_4_ = 0x2868;
        }
        else {
          AVar2 = amqpvalue_get_type((AMQP_VALUE)sasl_server_mechanisms_single_value);
          if (AVar2 == AMQP_TYPE_ARRAY) {
            memset(&stack0xffffffffffffffc8,0,8);
            single_amqp_value._4_4_ = 1;
          }
          else {
            single_amqp_value._4_4_ =
                 amqpvalue_get_symbol
                           ((AMQP_VALUE)sasl_server_mechanisms_single_value,&stack0xffffffffffffffc8
                           );
          }
          AVar2 = amqpvalue_get_type((AMQP_VALUE)sasl_server_mechanisms_single_value);
          if (((AVar2 == AMQP_TYPE_ARRAY) &&
              (iVar1 = amqpvalue_get_array((AMQP_VALUE)sasl_server_mechanisms_single_value,
                                           _item_count), iVar1 == 0)) ||
             (single_amqp_value._4_4_ == 0)) {
            AVar2 = amqpvalue_get_type((AMQP_VALUE)sasl_server_mechanisms_single_value);
            if (AVar2 == AMQP_TYPE_ARRAY) {
              sasl_mechanisms_instance._4_4_ = 0;
            }
            else {
              pAVar3 = amqpvalue_create_array();
              *_item_count = pAVar3;
              if (*_item_count == (AMQP_VALUE)0x0) {
                sasl_mechanisms_instance._4_4_ = 0x2884;
              }
              else {
                pAVar3 = amqpvalue_create_symbol(pcStack_38);
                if (pAVar3 == (AMQP_VALUE)0x0) {
                  sasl_mechanisms_instance._4_4_ = 0x288b;
                }
                else {
                  iVar1 = amqpvalue_add_array_item(*_item_count,pAVar3);
                  if (iVar1 == 0) {
                    iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)item_value,0,*_item_count);
                    if (iVar1 == 0) {
                      sasl_mechanisms_instance._4_4_ = 0;
                    }
                    else {
                      sasl_mechanisms_instance._4_4_ = 0x2897;
                    }
                  }
                  else {
                    sasl_mechanisms_instance._4_4_ = 0x2891;
                  }
                  amqpvalue_destroy(pAVar3);
                }
                amqpvalue_destroy(*_item_count);
              }
            }
          }
          else {
            sasl_mechanisms_instance._4_4_ = 0x287b;
          }
        }
      }
    }
    else {
      sasl_mechanisms_instance._4_4_ = 0x285a;
    }
  }
  return sasl_mechanisms_instance._4_4_;
}

Assistant:

int sasl_mechanisms_get_sasl_server_mechanisms(SASL_MECHANISMS_HANDLE sasl_mechanisms, AMQP_VALUE* sasl_server_mechanisms_value)
{
    int result;

    if (sasl_mechanisms == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        SASL_MECHANISMS_INSTANCE* sasl_mechanisms_instance = (SASL_MECHANISMS_INSTANCE*)sasl_mechanisms;
        if (amqpvalue_get_composite_item_count(sasl_mechanisms_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(sasl_mechanisms_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    const char* sasl_server_mechanisms_single_value;
                    int get_single_value_result;
                    if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                    {
                        get_single_value_result = amqpvalue_get_symbol(item_value, &sasl_server_mechanisms_single_value);
                    }
                    else
                    {
                        (void)memset((void*)&sasl_server_mechanisms_single_value, 0, sizeof(sasl_server_mechanisms_single_value));
                        get_single_value_result = 1;
                    }

                    if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, sasl_server_mechanisms_value) != 0)) &&
                        (get_single_value_result != 0))
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                        {
                            *sasl_server_mechanisms_value = amqpvalue_create_array();
                            if (*sasl_server_mechanisms_value == NULL)
                            {
                                result = MU_FAILURE;
                            }
                            else
                            {
                                AMQP_VALUE single_amqp_value = amqpvalue_create_symbol(sasl_server_mechanisms_single_value);
                                if (single_amqp_value == NULL)
                                {
                                    result = MU_FAILURE;
                                }
                                else
                                {
                                    if (amqpvalue_add_array_item(*sasl_server_mechanisms_value, single_amqp_value) != 0)
                                    {
                                        result = MU_FAILURE;
                                    }
                                    else
                                    {
                                        if (amqpvalue_set_composite_item(sasl_mechanisms_instance->composite_value, 0, *sasl_server_mechanisms_value) != 0)
                                        {
                                            result = MU_FAILURE;
                                        }
                                        else
                                        {
                                            result = 0;
                                        }
                                    }

                                    amqpvalue_destroy(single_amqp_value);
                                }
                                amqpvalue_destroy(*sasl_server_mechanisms_value);
                            }
                        }
                        else
                        {
                            result = 0;
                        }
                    }
                }
            }
        }
    }

    return result;
}